

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O1

void __thiscall
CmdLineArgsParser::ParseRange(CmdLineArgsParser *this,Range *pRange,Range *oppositeRange)

{
  WCHAR WVar1;
  SourceFunctionNode i;
  SourceFunctionNode j;
  undefined8 *puVar2;
  char16_t *pcVar3;
  
  while( true ) {
    while( true ) {
      i = ParseSourceFunctionIds(this);
      WVar1 = *this->pszCurrentArg;
      if (0x2c < (ushort)WVar1) break;
      if (WVar1 != L',') {
        if ((WVar1 == L'\0') || (WVar1 == L' ')) {
          Js::RangeBase<Js::SourceFunctionNode>::Add
                    (&pRange->super_RangeBase<Js::SourceFunctionNode>,i,i,
                     &oppositeRange->super_RangeBase<Js::SourceFunctionNode>);
          return;
        }
        goto LAB_00353a9b;
      }
      Js::RangeBase<Js::SourceFunctionNode>::Add
                (&pRange->super_RangeBase<Js::SourceFunctionNode>,i,i,
                 &oppositeRange->super_RangeBase<Js::SourceFunctionNode>);
      this->pszCurrentArg = this->pszCurrentArg + 1;
    }
    if (WVar1 != L'-') goto LAB_00353a9b;
    this->pszCurrentArg = this->pszCurrentArg + 1;
    j = ParseSourceFunctionIds(this);
    if (j.sourceContextId < i.sourceContextId) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar3 = L"Left source index must be smaller than the Right source Index";
      goto LAB_00353ad2;
    }
    if (j.sourceContextId == i.sourceContextId) {
      if (j.functionId < i.functionId) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar3 = 
        L"Left functionId must be smaller than the Right functionId when Source file is the same";
        goto LAB_00353ad2;
      }
    }
    Js::RangeBase<Js::SourceFunctionNode>::Add
              (&pRange->super_RangeBase<Js::SourceFunctionNode>,i,j,
               &oppositeRange->super_RangeBase<Js::SourceFunctionNode>);
    WVar1 = *this->pszCurrentArg;
    if (WVar1 != L',') break;
    this->pszCurrentArg = this->pszCurrentArg + 1;
  }
  if ((WVar1 == L'\0') || (WVar1 == L' ')) {
    return;
  }
LAB_00353a9b:
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  pcVar3 = L"Unexpected character while parsing Range";
LAB_00353ad2:
  *puVar2 = pcVar3;
  __cxa_throw(puVar2,&Exception::typeinfo,0);
}

Assistant:

void
CmdLineArgsParser::ParseRange(Js::Range *pRange, Js::Range *oppositeRange)
{
    SourceFunctionNode r1 = ParseSourceFunctionIds();
    SourceFunctionNode r2;
    switch(CurChar())
    {
    case '-':
        NextChar();
        r2 = ParseSourceFunctionIds();

        if (r1.sourceContextId > r2.sourceContextId)
        {
            throw Exception(_u("Left source index must be smaller than the Right source Index"));
        }
        if ((r1.sourceContextId == r2.sourceContextId) &&
            (r1.functionId > r2.functionId))
        {
            throw Exception(_u("Left functionId must be smaller than the Right functionId when Source file is the same"));
        }

        pRange->Add(r1, r2, oppositeRange);
        switch(CurChar())
        {
        case ',':
            NextChar();
            ParseRange(pRange, oppositeRange);
            break;

        case ' ':
        case 0:
            break;

        default:
            throw Exception(_u("Unexpected character while parsing Range"));
        }
        break;

    case ',':
        pRange->Add(r1, oppositeRange);
        NextChar();
        ParseRange(pRange, oppositeRange);
        break;

    case ' ':
    case 0:
        pRange->Add(r1, oppositeRange);
        break;

    default:
        throw Exception(_u("Unexpected character while parsing Range"));
    }

}